

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::unwanted_block_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,unwanted_block_alert *this)

{
  char ret [200];
  string local_108;
  char local_e8 [208];
  
  peer_alert::message_abi_cxx11_(&local_108,&this->super_peer_alert);
  snprintf(local_e8,200,"%s received block not in download queue (piece: %d block: %d)",
           local_108._M_dataplus._M_p,(ulong)(uint)(this->piece_index).m_val,
           (ulong)*(uint *)&(this->super_peer_alert).field_0x9c);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string unwanted_block_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "%s received block not in download queue (piece: %d block: %d)"
			, peer_alert::message().c_str(), static_cast<int>(piece_index), block_index);
		return ret;
	}